

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,void **vtt,string *name,bool quiet,Encoding encoding)

{
  _func_int **pp_Var1;
  codecvt *this_00;
  locale local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  locale local_38;
  
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       pp_Var1;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[5];
  std::ofstream::ofstream
            (this,(char *)(vtt + 1),
             (_Ios_Openmode)*(undefined8 *)&(this->super_ofstream).field_0x118);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       pp_Var1;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[5];
  if (((&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0 && !quiet) {
    std::operator+(&local_58,"Cannot open file for write: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_ofstream).field_0x118);
    cmSystemTools::Error(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::ReportLastSystemError("");
  }
  if (encoding != None) {
    std::locale::locale(&local_60,
                        (locale *)
                        (&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                          field_0xd0 +
                        (long)(this->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]));
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,encoding);
    std::locale::locale<codecvt>((locale *)&local_58,&local_60,this_00);
    std::ios::imbue(&local_38);
    std::locale::~locale(&local_38);
    std::locale::~locale((locale *)&local_58);
    std::locale::~locale(&local_60);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(std::string const& name,
                                             bool quiet, Encoding encoding)
  : cmGeneratedFileStreamBase(name)
  , Stream(TempName.c_str())
{
  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: " + this->TempName);
    cmSystemTools::ReportLastSystemError("");
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (encoding != codecvt::None) {
    imbue(std::locale(getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}